

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.h
# Opt level: O2

void __thiscall
test_fixture::add_test(test_fixture *this,offset_in_test_fixture_to_subr test,string *name)

{
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  bool local_10;
  
  local_50._M_p = (pointer)&local_40;
  local_68._0_8_ = (test_fixture *)0x0;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_30._M_p = (pointer)&local_20;
  local_28 = 0;
  local_20._M_local_buf[0] = '\0';
  local_10 = false;
  local_68._8_8_ = test;
  local_68._16_8_ = name;
  std::__cxx11::string::_M_assign((string *)&local_50);
  local_68._0_8_ = this;
  std::vector<test_host,_std::allocator<test_host>_>::push_back
            (&this->_tests,(value_type *)local_68);
  test_host::~test_host((test_host *)local_68);
  return;
}

Assistant:

void add_test( void (test_fixture::*test)(), std::string name )
    {
        struct test_host tc;
        tc.test = test;
        tc.test_name = name;
        tc.fixture = this;
        _tests.push_back( tc );
    }